

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O1

CharString *
icu_63::buildResourcePath(CharString *path,char *segment1,char *segment2,UErrorCode *errorCode)

{
  CharString *pCVar1;
  
  path->len = 0;
  *(path->buffer).ptr = '\0';
  pCVar1 = CharString::append(path,segment1,-1,errorCode);
  pCVar1 = CharString::append(pCVar1,'/',errorCode);
  pCVar1 = CharString::append(pCVar1,segment2,-1,errorCode);
  return pCVar1;
}

Assistant:

static CharString
&buildResourcePath(CharString &path, const char* segment1, const char* segment2,
                   UErrorCode &errorCode) {
    return buildResourcePath(path, segment1, errorCode).append('/', errorCode)
                                                       .append(segment2, -1, errorCode);
}